

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool scanImports(Options *options,QSet<QString> *usedDependencies)

{
  QLatin1StringView str;
  QAnyStringView s;
  QLatin1StringView str_00;
  QAnyStringView s_00;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *pFVar8;
  size_t sVar9;
  qsizetype qVar10;
  QString *pQVar11;
  long in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_char16_t> QVar12;
  QLatin1StringView QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QVariant *qmlFileEntry;
  QVariantList *__range5;
  bool qmlFilesMissing;
  bool pluginIsOptional;
  QString *importPath;
  add_const_t<QList<QString>_> *__range4;
  int i;
  QString *qrcFile;
  QStringList *__range2;
  vector<QString,_std::allocator<QString>_> *__range1_3;
  QString *import;
  QStringList *__range1_2;
  bool qmlImportExists;
  QString *qmlImportPath;
  add_const_t<QList<QString>_> *__range1_1;
  QString *prefix;
  vector<QString,_std::allocator<QString>_> *__range1;
  QFileInfo fileInfo;
  iterator __end5;
  iterator __begin5;
  QVariantList qmlFiles;
  QString prefer;
  QFileInfo qmldirFileInfo;
  QSet<QString> remainingDependencies;
  QString pluginFilePath;
  QFileInfo pluginFileInfo;
  QString plugin;
  anon_class_24_3_0a0102aa collectQmlDependency;
  QList<QtDependency> qmlImportsDependencies;
  QString cleanImportPath;
  const_iterator __end4;
  const_iterator __begin4;
  QString importPathOfThisImport;
  QString moduleUrlPath;
  QUrl url;
  QString absolutePath;
  QFileInfo info;
  QString path;
  QJsonObject object;
  QJsonArray jsonArray;
  QJsonDocument jsonDocument;
  QByteArray output;
  UP qmlImportScannerCommand;
  iterator __end2;
  iterator __begin2;
  QString rootPath;
  iterator __end1_3;
  iterator __begin1_3;
  iterator __end1_2;
  iterator __begin1_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  iterator __end1;
  iterator __begin1;
  QString mainImportPath;
  QStringList importPaths;
  QString qmlImportScanner;
  QJsonValue value;
  char buffer [512];
  ArgBase *argBases [2];
  ArgBase *argBases_1 [2];
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>,_QLatin1String>
  *in_stack_ffffffffffffefd8;
  undefined4 in_stack_ffffffffffffefe0;
  int in_stack_ffffffffffffefe4;
  int iVar24;
  QAnyStringView *in_stack_ffffffffffffefe8;
  Options *in_stack_ffffffffffffeff0;
  undefined6 in_stack_ffffffffffffeff8;
  QChar in_stack_ffffffffffffeffe;
  QStringBuilder<char16_t,_QString> *in_stack_fffffffffffff008;
  undefined8 *puVar25;
  QString *in_stack_fffffffffffff010;
  undefined7 in_stack_fffffffffffff030;
  QSet<QString> *usedDependencies_00;
  FILE *in_stack_fffffffffffff040;
  undefined7 in_stack_fffffffffffff048;
  byte in_stack_fffffffffffff04f;
  char *local_ed8;
  int local_e3c;
  int local_e0c;
  byte local_dc1;
  undefined1 local_d58 [24];
  undefined8 local_d40;
  QVariant *local_d38;
  iterator local_d30;
  iterator local_d28;
  QJsonArray local_d20 [32];
  QJsonArray local_d00 [8];
  undefined8 local_cf8;
  undefined8 local_cf0;
  undefined8 local_ce8;
  undefined8 local_ce0;
  undefined8 local_cd8;
  undefined8 local_cd0;
  QLatin1StringView local_cb0;
  QString *local_ca0;
  char16_t local_c98;
  undefined2 local_c8a;
  undefined1 local_c88 [24];
  undefined8 local_c70;
  undefined8 local_c68;
  undefined8 local_c60;
  undefined8 local_c58;
  undefined8 local_c50;
  QLatin1StringView local_c48;
  undefined2 local_c32;
  QLatin1StringView local_c30;
  QString *local_c20;
  char16_t local_c18;
  undefined2 local_c0a;
  undefined1 local_c08 [24];
  QSet<QString> *local_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  QSet<QString> *local_bd8;
  undefined1 *local_bc8;
  undefined8 *puStack_bc0;
  QString *local_bb8;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined2 local_b8a;
  QDir local_b88 [8];
  undefined1 local_b80 [24];
  QAnyStringView local_b68;
  QString local_b50 [2];
  QStringBuilder<QString_&,_const_QString_&> local_b20;
  undefined1 local_b10 [24];
  undefined8 local_af8;
  undefined8 local_af0;
  undefined8 local_ae8;
  QString *local_ae0;
  const_iterator local_ad8;
  const_iterator local_ad0;
  QString local_ac8 [2];
  QChar local_a98;
  QChar local_a96;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_a94;
  undefined1 local_a90 [80];
  undefined8 local_a40;
  undefined8 local_a38;
  undefined8 local_a30;
  undefined1 local_a28 [24];
  undefined8 local_a10;
  QChar local_a04;
  QChar local_a02;
  undefined8 local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined8 local_9e8 [4];
  QLatin1StringView local_9c8;
  QString local_9a0 [2];
  QString local_970;
  undefined8 local_958;
  undefined8 local_950;
  undefined8 local_948;
  QByteArray local_940;
  QJsonParseError local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined8 local_910;
  QChar local_8ea [13];
  QLatin1StringView local_8d0;
  undefined1 local_8c0 [54];
  undefined2 local_88a;
  QString *local_868;
  iterator local_860;
  iterator local_858 [4];
  QLatin1StringView local_838;
  undefined1 local_828 [52];
  QChar local_7f4;
  QChar local_7f2;
  QFileInfo local_7f0 [32];
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  QString *local_7b8;
  __normal_iterator<QString_*,_std::vector<QString,_std::allocator<QString>_>_> local_7b0 [4];
  QLatin1StringView local_790;
  QLatin1StringView local_780;
  undefined1 local_770 [24];
  QDir local_758 [8];
  QString *local_750;
  iterator local_748;
  iterator local_740 [7];
  QString *local_708;
  const_iterator local_700;
  const_iterator local_6f8;
  QLatin1StringView local_6f0;
  QLatin1StringView local_698;
  undefined1 local_670 [24];
  QString *local_658;
  __normal_iterator<QString_*,_std::vector<QString,_std::allocator<QString>_>_> local_650 [4];
  QString *local_630;
  char16_t local_628;
  undefined2 local_61a;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  QLatin1StringView local_5e0;
  QString local_588;
  undefined1 local_570 [24];
  undefined1 local_558 [24];
  qsizetype local_540;
  char *local_538;
  ulong local_530;
  ArgBase **local_528;
  Data local_510;
  qsizetype local_4f8;
  char *local_4f0;
  ulong local_4e8;
  ArgBase **local_4e0;
  ulong local_4d8;
  ArgBase **local_4d0;
  ulong local_4c8;
  ArgBase **local_4c0;
  ulong local_4b8;
  ArgBase **local_4b0;
  ulong local_4a8;
  ArgBase **local_4a0;
  QJsonValue local_498 [24];
  QJsonValue local_480 [24];
  QJsonValue local_468 [24];
  QString *local_450;
  char16_t local_448;
  QString *local_420;
  char16_t local_418;
  QJsonValue local_318 [24];
  QJsonValue local_300 [24];
  undefined1 local_2e8 [56];
  QJsonValue local_2b0 [24];
  QJsonValue local_298 [24];
  QJsonValue local_280 [24];
  char16_t *local_268;
  qsizetype local_260;
  Data *local_258;
  QString *local_250;
  char16_t local_248;
  char local_228 [512];
  Data *local_28;
  char *local_20;
  undefined1 *local_18;
  Data *local_10;
  char *local_8;
  
  local_8 = *(char **)(in_FS_OFFSET + 0x28);
  local_e0c = in_stack_ffffffffffffefe4;
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    fprintf(_stdout,"Scanning for QML imports.\n");
    local_e0c = in_stack_ffffffffffffefe4;
  }
  local_588.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_588.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_588.d.size = -0x5555555555555556;
  QString::QString((QString *)0x12175c);
  bVar1 = QString::isEmpty((QString *)0x121770);
  if (bVar1) {
    local_5e0 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_ffffffffffffefe8,
                           CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
    operator+((QString *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
              (QLatin1String *)in_stack_ffffffffffffefd8);
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_QLatin1String> *)in_stack_ffffffffffffefd8);
    execSuffixAppended((QString *)in_stack_ffffffffffffefd8);
    QString::operator=((QString *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                       (QString *)in_stack_ffffffffffffefd8);
    QString::~QString((QString *)0x121835);
    QString::~QString((QString *)0x121842);
  }
  else {
    QString::operator=(&local_588,(QString *)(in_RDI + 0x5c8));
  }
  local_5f8 = 0xaaaaaaaaaaaaaaaa;
  uStack_5f0 = 0xaaaaaaaaaaaaaaaa;
  local_5e8 = 0xaaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x121878);
  local_608 = 0xaaaaaaaaaaaaaaaa;
  local_618 = 0xaaaaaaaaaaaaaaaa;
  uStack_610 = 0xaaaaaaaaaaaaaaaa;
  local_61a = 0x2f;
  QVar12 = operator+((QString *)in_stack_ffffffffffffefe8,
                     (char16_t *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
  local_630 = QVar12.a;
  local_628 = QVar12.b;
  local_250 = local_630;
  local_248 = local_628;
  operator+((QStringBuilder<QString_&,_char16_t> *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
            (QString *)in_stack_ffffffffffffefd8);
  QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString_&> *)
             in_stack_ffffffffffffefd8);
  uVar5 = QFile::exists((QString *)&local_618);
  if ((uVar5 & 1) != 0) {
    shellQuote((QString *)in_stack_ffffffffffffefe8);
    QList<QString>::operator+=
              ((QList<QString> *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
               (rvalue_ref)in_stack_ffffffffffffefd8);
    QString::~QString((QString *)0x121970);
  }
  local_650[0]._M_current = (QString *)0xaaaaaaaaaaaaaaaa;
  local_650[0]._M_current =
       (QString *)
       std::vector<QString,_std::allocator<QString>_>::begin
                 ((vector<QString,_std::allocator<QString>_> *)
                  CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
  local_658 = (QString *)0xaaaaaaaaaaaaaaaa;
  local_658 = (QString *)
              std::vector<QString,_std::allocator<QString>_>::end
                        ((vector<QString,_std::allocator<QString>_> *)
                         CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                             *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                            (__normal_iterator<QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                             *)in_stack_ffffffffffffefd8), bVar1) {
    __gnu_cxx::__normal_iterator<QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
    operator*(local_650);
    local_698 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_ffffffffffffefe8,
                           CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
    operator+((QString *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
              (QLatin1String *)in_stack_ffffffffffffefd8);
    QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_QString_&,_QLatin1String> *)in_stack_ffffffffffffefd8);
    bVar3 = QFile::exists((QString *)local_670);
    QString::~QString((QString *)0x121aa9);
    if ((bVar3 & 1) != 0) {
      local_6f0 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_ffffffffffffefe8,
                             CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
      operator+((QString *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                (QLatin1String *)in_stack_ffffffffffffefd8);
      QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<const_QString_&,_QLatin1String> *)in_stack_ffffffffffffefd8);
      shellQuote((QString *)in_stack_ffffffffffffefe8);
      QList<QString>::operator+=
                ((QList<QString> *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                 (rvalue_ref)in_stack_ffffffffffffefd8);
      QString::~QString((QString *)0x121b53);
      QString::~QString((QString *)0x121b60);
    }
    __gnu_cxx::__normal_iterator<QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
    operator++(local_650);
  }
  local_6f8.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_6f8 = QList<QString>::begin((QList<QString> *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0))
  ;
  local_700.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_700 = QList<QString>::end((QList<QString> *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
  while( true ) {
    local_708 = local_700.i;
    bVar1 = QList<QString>::const_iterator::operator!=(&local_6f8,local_700);
    if (!bVar1) break;
    pQVar11 = QList<QString>::const_iterator::operator*(&local_6f8);
    uVar5 = QFile::exists((QString *)pQVar11);
    pFVar8 = _stderr;
    if ((uVar5 & 1) == 0) {
      QtPrivate::asString(pQVar11);
      QString::toLocal8Bit
                ((QString *)CONCAT26(in_stack_ffffffffffffeffe.ucs,in_stack_ffffffffffffeff8));
      pcVar7 = QByteArray::constData((QByteArray *)0x121cc1);
      fprintf(pFVar8,"Warning: QML import path %s does not exist.\n",pcVar7);
      QByteArray::~QByteArray((QByteArray *)0x121ce7);
    }
    else {
      shellQuote((QString *)in_stack_ffffffffffffefe8);
      QList<QString>::operator+=
                ((QList<QString> *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                 (rvalue_ref)in_stack_ffffffffffffefd8);
      QString::~QString((QString *)0x121c83);
    }
    QList<QString>::const_iterator::operator++(&local_6f8);
  }
  bVar1 = false;
  local_740[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_740[0] = QList<QString>::begin
                           ((QList<QString> *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
  local_748.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_748 = QList<QString>::end((QList<QString> *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
  while( true ) {
    local_750 = local_748.i;
    bVar2 = QList<QString>::iterator::operator!=(local_740,local_748);
    if (!bVar2) break;
    QList<QString>::iterator::operator*(local_740);
    QString::QString((QString *)0x121dcf);
    QDir::QDir(local_758,(QString *)local_770);
    bVar3 = QDir::exists((QString *)local_758);
    QDir::~QDir(local_758);
    QString::~QString((QString *)0x121e1a);
    if ((bVar3 & 1) != 0) {
      bVar1 = true;
      break;
    }
    QList<QString>::iterator::operator++(local_740);
  }
  if (bVar1) {
    uVar5 = QFile::exists((QString *)&local_588);
    pFVar8 = _stderr;
    if ((uVar5 & 1) == 0) {
      local_780 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_ffffffffffffefe8,
                             CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
      pcVar6 = QLatin1String::data(&local_780);
      local_790 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_ffffffffffffefe8,
                             CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
      pcVar7 = QLatin1String::data(&local_790);
      if (bVar1) {
        pcVar7 = pcVar6;
      }
      QtPrivate::asString(&local_588);
      QString::toLocal8Bit
                ((QString *)CONCAT26(in_stack_ffffffffffffeffe.ucs,in_stack_ffffffffffffeff8));
      pcVar6 = QByteArray::constData((QByteArray *)0x121f60);
      fprintf(pFVar8,"%s: qmlimportscanner not found at %s\n",pcVar7,pcVar6);
      QByteArray::~QByteArray((QByteArray *)0x121f8e);
      local_dc1 = 1;
    }
    else {
      local_7b0[0]._M_current = (QString *)0xaaaaaaaaaaaaaaaa;
      local_7b0[0]._M_current =
           (QString *)
           std::vector<QString,_std::allocator<QString>_>::begin
                     ((vector<QString,_std::allocator<QString>_> *)
                      CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
      local_7b8 = (QString *)0xaaaaaaaaaaaaaaaa;
      local_7b8 = (QString *)
                  std::vector<QString,_std::allocator<QString>_>::end
                            ((vector<QString,_std::allocator<QString>_> *)
                             CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                                 *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                                (__normal_iterator<QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                                 *)in_stack_ffffffffffffefd8), bVar1) {
        local_7d0 = 0xaaaaaaaaaaaaaaaa;
        local_7c8 = 0xaaaaaaaaaaaaaaaa;
        local_7c0 = 0xaaaaaaaaaaaaaaaa;
        __gnu_cxx::__normal_iterator<QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
        operator*(local_7b0);
        QString::QString((QString *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                         (QString *)in_stack_ffffffffffffefd8);
        QFileInfo::QFileInfo(local_7f0,(QString *)&local_7d0);
        QFileInfo::absoluteFilePath();
        QString::operator=((QString *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                           (QString *)in_stack_ffffffffffffefd8);
        QString::~QString((QString *)0x1220ca);
        QFileInfo::~QFileInfo(local_7f0);
        QChar::QChar<char16_t,_true>(&local_7f2,L'/');
        uVar5 = QString::endsWith((QChar)(char16_t)&local_7d0,(uint)(ushort)local_7f2.ucs);
        if ((uVar5 & 1) == 0) {
          QChar::QChar<char16_t,_true>(&local_7f4,L'/');
          QString::operator+=((QString *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                              (QChar)(char16_t)((ulong)in_stack_ffffffffffffefe8 >> 0x30));
        }
        bVar1 = QString::isEmpty((QString *)0x12213b);
        if (!bVar1) {
          shellQuote((QString *)in_stack_ffffffffffffefe8);
          QList<QString>::operator+=
                    ((QList<QString> *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                     (rvalue_ref)in_stack_ffffffffffffefd8);
          QString::~QString((QString *)0x122176);
        }
        local_838 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_ffffffffffffefe8,
                               CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
        shellQuote((QString *)in_stack_ffffffffffffefe8);
        local_4f8 = local_838.m_size;
        local_4f0 = local_838.m_data;
        str.m_data._0_6_ = in_stack_ffffffffffffeff8;
        str.m_size = (qsizetype)in_stack_ffffffffffffeff0;
        str.m_data._6_2_ = in_stack_ffffffffffffeffe.ucs;
        QAnyStringView::QAnyStringView(in_stack_ffffffffffffefe8,str);
        QAnyStringView::QAnyStringView
                  ((QAnyStringView *)in_stack_ffffffffffffeff0,(QString *)in_stack_ffffffffffffefe8)
        ;
        s.m_size._0_6_ = in_stack_ffffffffffffeff8;
        s.field_0.m_data = in_stack_ffffffffffffeff0;
        s.m_size._6_2_ = in_stack_ffffffffffffeffe.ucs;
        QtPrivate::qStringLikeToArg(s);
        local_4c8 = local_4e8;
        local_4c0 = local_4e0;
        local_28 = &local_510;
        local_20 = (char *)0x0;
        local_4d8 = local_4e8;
        local_4d0 = local_4e0;
        QtPrivate::argToQString((QAnyStringView *)local_828,local_4e8,local_4e0);
        QString::operator+=((QString *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                            (QString *)in_stack_ffffffffffffefd8);
        QString::~QString((QString *)0x122330);
        QString::~QString((QString *)0x12233d);
        QString::~QString((QString *)0x12234a);
        __gnu_cxx::__normal_iterator<QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
        operator++(local_7b0);
      }
      bVar1 = QList<QString>::isEmpty((QList<QString> *)0x122370);
      if (!bVar1) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_ffffffffffffefe8,CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
        QVar13.m_data._0_6_ = in_stack_ffffffffffffeff8;
        QVar13.m_size = (qsizetype)in_stack_ffffffffffffeff0;
        QVar13.m_data._6_2_ = in_stack_ffffffffffffeffe.ucs;
        QString::operator+=((QString *)in_stack_ffffffffffffefd8,QVar13);
        local_858[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
        local_858[0] = QList<QString>::begin
                                 ((QList<QString> *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
        local_860.i = (QString *)0xaaaaaaaaaaaaaaaa;
        local_860 = QList<QString>::end((QList<QString> *)
                                        CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
        while( true ) {
          local_868 = local_860.i;
          bVar1 = QList<QString>::iterator::operator!=(local_858,local_860);
          if (!bVar1) break;
          QList<QString>::iterator::operator*(local_858);
          local_88a = 0x20;
          shellQuote((QString *)in_stack_ffffffffffffefe8);
          operator+((char16_t *)in_stack_ffffffffffffefe8,
                    (QString *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
          operator+=(in_stack_fffffffffffff010,in_stack_fffffffffffff008);
          QStringBuilder<char16_t,_QString>::~QStringBuilder
                    ((QStringBuilder<char16_t,_QString> *)0x1224d9);
          QString::~QString((QString *)0x1224e6);
          QList<QString>::iterator::operator++(local_858);
        }
      }
      local_8d0 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_ffffffffffffefe8,
                             CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
      QChar::QChar<char16_t,_true>(local_8ea,L' ');
      QListSpecialMethods<QString>::join
                ((QListSpecialMethods<QString> *)in_stack_ffffffffffffefe8,in_stack_ffffffffffffeffe
                );
      local_540 = local_8d0.m_size;
      local_538 = local_8d0.m_data;
      str_00.m_data._0_6_ = in_stack_ffffffffffffeff8;
      str_00.m_size = (qsizetype)in_stack_ffffffffffffeff0;
      str_00.m_data._6_2_ = in_stack_ffffffffffffeffe.ucs;
      QAnyStringView::QAnyStringView(in_stack_ffffffffffffefe8,str_00);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_ffffffffffffeff0,(QString *)in_stack_ffffffffffffefe8);
      s_00.m_size._0_6_ = in_stack_ffffffffffffeff8;
      s_00.field_0.m_data = in_stack_ffffffffffffeff0;
      s_00.m_size._6_2_ = in_stack_ffffffffffffeffe.ucs;
      QtPrivate::qStringLikeToArg(s_00);
      local_4a8 = local_530;
      local_4a0 = local_528;
      local_18 = local_558;
      local_10 = (Data *)0x0;
      local_4b8 = local_530;
      local_4b0 = local_528;
      QtPrivate::argToQString((QAnyStringView *)local_8c0,local_530,local_528);
      QString::operator+=((QString *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                          (QString *)in_stack_ffffffffffffefd8);
      QString::~QString((QString *)0x1226ce);
      QString::~QString((QString *)0x1226db);
      pFVar8 = _stdout;
      if ((*(byte *)(in_RDI + 1) & 1) != 0) {
        QString::toLocal8Bit
                  ((QString *)CONCAT26(in_stack_ffffffffffffeffe.ucs,in_stack_ffffffffffffeff8));
        pcVar7 = QByteArray::constData((QByteArray *)0x12271d);
        fprintf(pFVar8,"Running qmlimportscanner with the following command: %s\n",pcVar7);
        QByteArray::~QByteArray((QByteArray *)0x122743);
      }
      local_910 = 0xaaaaaaaaaaaaaaaa;
      openProcess((QString *)CONCAT26(in_stack_ffffffffffffeffe.ucs,in_stack_ffffffffffffeff8));
      bVar1 = std::operator==((unique_ptr<_IO_FILE,_Closer> *)
                              CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                              in_stack_ffffffffffffefd8);
      if (bVar1) {
        fprintf(_stderr,"Couldn\'t run qmlimportscanner.\n");
        local_dc1 = 0;
      }
      else {
        local_928.offset = -0x55555556;
        local_928.error = 0xaaaaaaaa;
        local_920 = 0xaaaaaaaaaaaaaaaa;
        local_918 = 0xaaaaaaaaaaaaaaaa;
        QByteArray::QByteArray((QByteArray *)0x1227e8);
        memset(local_228,0xaa,0x200);
        while( true ) {
          pFVar8 = (FILE *)std::unique_ptr<_IO_FILE,_Closer>::get
                                     ((unique_ptr<_IO_FILE,_Closer> *)0x12281c);
          pcVar7 = fgets(local_228,0x200,pFVar8);
          if (pcVar7 == (char *)0x0) break;
          sVar9 = qstrlen((char *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
          QByteArray::QByteArray(&local_940,local_228,sVar9);
          QByteArray::operator+=
                    ((QByteArray *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0),
                     (QByteArray *)in_stack_ffffffffffffefd8);
          QByteArray::~QByteArray((QByteArray *)0x12288e);
        }
        local_948 = 0xaaaaaaaaaaaaaaaa;
        QJsonDocument::fromJson((QByteArray *)&local_948,&local_928);
        uVar5 = QJsonDocument::isNull();
        if ((uVar5 & 1) == 0) {
          local_950 = 0xaaaaaaaaaaaaaaaa;
          QJsonDocument::array();
          iVar24 = local_e0c;
          for (local_e3c = 0; qVar10 = QJsonArray::count((QJsonArray *)0x12294a), local_e3c < qVar10
              ; local_e3c = local_e3c + 1) {
            local_268 = (char16_t *)0xaaaaaaaaaaaaaaaa;
            local_260 = -0x5555555555555556;
            local_258 = (Data *)0xaaaaaaaaaaaaaaaa;
            QJsonArray::at((longlong)&local_268);
            bVar1 = QJsonValue::isObject((QJsonValue *)0x1229b5);
            if (bVar1) {
              local_958 = 0xaaaaaaaaaaaaaaaa;
              QJsonValue::toObject();
              local_970.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_970.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_970.d.size = -0x5555555555555556;
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_ffffffffffffefe8,
                         CONCAT44(iVar24,in_stack_ffffffffffffefe0));
              QVar14.m_data = (char *)&local_958;
              QVar14.m_size = (qsizetype)local_280;
              QJsonObject::value(QVar14);
              QJsonValue::toString();
              QJsonValue::~QJsonValue(local_280);
              bVar1 = QString::isEmpty((QString *)0x122aaf);
              pFVar8 = _stderr;
              if (bVar1) {
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_ffffffffffffefe8,
                           CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                QVar15.m_data = (char *)&local_958;
                QVar15.m_size = (qsizetype)local_298;
                QJsonObject::value(QVar15);
                QJsonValue::toString();
                QtPrivate::asString(local_9a0);
                QString::toLocal8Bit
                          ((QString *)
                           CONCAT26(in_stack_ffffffffffffeffe.ucs,in_stack_ffffffffffffeff8));
                pcVar7 = QByteArray::constData((QByteArray *)0x122b4f);
                fprintf(pFVar8,
                        "Warning: QML import could not be resolved in any of the import paths: %s\n"
                        ,pcVar7);
                QByteArray::~QByteArray((QByteArray *)0x122b75);
                QString::~QString((QString *)0x122b82);
                QJsonValue::~QJsonValue(local_298);
LAB_00123da7:
                local_e0c = 0;
              }
              else {
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_ffffffffffffefe8,
                           CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                QVar16.m_data = (char *)&local_958;
                QVar16.m_size = (qsizetype)local_2b0;
                QJsonObject::value(QVar16);
                QJsonValue::toString();
                local_9c8 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)in_stack_ffffffffffffefe8,
                                       CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                bVar1 = operator==((QString *)in_stack_ffffffffffffefe8,
                                   (QLatin1StringView *)CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                QString::~QString((QString *)0x122c39);
                QJsonValue::~QJsonValue(local_2b0);
                pFVar8 = _stdout;
                if (!bVar1) goto LAB_00123da7;
                if ((*(byte *)(in_RDI + 1) & 1) != 0) {
                  QtPrivate::asString(&local_970);
                  QString::toLocal8Bit
                            ((QString *)
                             CONCAT26(in_stack_ffffffffffffeffe.ucs,in_stack_ffffffffffffeff8));
                  pcVar7 = QByteArray::constData((QByteArray *)0x122ca0);
                  fprintf(pFVar8,"  -- Adding \'%s\' as QML dependency\n",pcVar7);
                  QByteArray::~QByteArray((QByteArray *)0x122cc6);
                }
                local_9e8[0] = 0xaaaaaaaaaaaaaaaa;
                QFileInfo::QFileInfo((QFileInfo *)local_9e8,(QString *)&local_970);
                uVar5 = QFileInfo::exists();
                if ((uVar5 & 1) == 0) {
                  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
                    fprintf(_stdout,"    -- Skipping because path does not exist.\n");
                  }
                  local_e0c = 0x10;
                }
                else {
                  local_a00 = 0xaaaaaaaaaaaaaaaa;
                  local_9f8 = 0xaaaaaaaaaaaaaaaa;
                  local_9f0 = 0xaaaaaaaaaaaaaaaa;
                  QFileInfo::absolutePath();
                  QChar::QChar<char16_t,_true>(&local_a02,L'/');
                  uVar5 = QString::endsWith((QChar)(char16_t)&local_a00,(uint)(ushort)local_a02.ucs)
                  ;
                  if ((uVar5 & 1) == 0) {
                    QChar::QChar<char16_t,_true>(&local_a04,L'/');
                    QString::operator+=((QString *)CONCAT44(iVar24,in_stack_ffffffffffffefe0),
                                        (QChar)(char16_t)((ulong)in_stack_ffffffffffffefe8 >> 0x30))
                    ;
                  }
                  local_a10 = 0xaaaaaaaaaaaaaaaa;
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_ffffffffffffefe8,
                             CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                  QVar17.m_data = (char *)&local_958;
                  QVar17.m_size = (qsizetype)(local_2e8 + 0x20);
                  QJsonObject::value(QVar17);
                  QJsonValue::toString();
                  QUrl::QUrl((QUrl *)&local_a10,local_a28,0);
                  QString::~QString((QString *)0x122e58);
                  QJsonValue::~QJsonValue((QJsonValue *)(local_2e8 + 0x20));
                  local_a40 = 0xaaaaaaaaaaaaaaaa;
                  local_a38 = 0xaaaaaaaaaaaaaaaa;
                  local_a30 = 0xaaaaaaaaaaaaaaaa;
                  Qt::Literals::StringLiterals::operator____s
                            ((char16_t *)
                             CONCAT26(in_stack_ffffffffffffeffe.ucs,in_stack_ffffffffffffeff8),
                             (size_t)in_stack_ffffffffffffeff0);
                  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::
                  QUrlTwoFlags(&local_a94,PrettyDecoded);
                  QUrl::toString((QUrlTwoFlags *)local_a90);
                  QChar::QChar<char16_t,_true>(&local_a96,L'.');
                  QChar::QChar<char16_t,_true>(&local_a98,L'/');
                  QString::replace((QChar)(char16_t)local_a90,local_a96,(uint)(ushort)local_a98.ucs)
                  ;
                  operator+((QString *)in_stack_ffffffffffffefe8,
                            (QString *)CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                  QStringBuilder::operator_cast_to_QString
                            ((QStringBuilder<QString,_QString_&> *)in_stack_ffffffffffffefd8);
                  QStringBuilder<QString,_QString_&>::~QStringBuilder
                            ((QStringBuilder<QString,_QString_&> *)0x122f59);
                  QString::~QString((QString *)0x122f66);
                  QString::~QString((QString *)0x122f73);
                  QFileInfo::absolutePath();
                  bVar1 = checkCanImportFromRootPaths
                                    (in_stack_ffffffffffffeff0,(QString *)in_stack_ffffffffffffefe8,
                                     (QString *)CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                  QString::~QString((QString *)0x122fc3);
                  if (bVar1) {
                    if ((*(byte *)(in_RDI + 1) & 1) != 0) {
                      fprintf(_stdout,"    -- Skipping because path is in QML root path.\n");
                    }
                    local_e0c = 0x10;
                  }
                  else {
                    local_ac8[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                    local_ac8[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                    local_ac8[0].d.size = -0x5555555555555556;
                    QString::QString((QString *)0x123040);
                    local_ad0.i = (QString *)0xaaaaaaaaaaaaaaaa;
                    local_ad0 = QList<QString>::begin
                                          ((QList<QString> *)
                                           CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                    local_ad8.i = (QString *)0xaaaaaaaaaaaaaaaa;
                    local_ad8 = QList<QString>::end((QList<QString> *)
                                                    CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                    while( true ) {
                      local_ae0 = local_ad8.i;
                      bVar1 = QList<QString>::const_iterator::operator!=(&local_ad0,local_ad8);
                      if (!bVar1) break;
                      pQVar11 = QList<QString>::const_iterator::operator*(&local_ad0);
                      local_af8 = 0xaaaaaaaaaaaaaaaa;
                      local_af0 = 0xaaaaaaaaaaaaaaaa;
                      local_ae8 = 0xaaaaaaaaaaaaaaaa;
                      QDir::cleanPath((QString *)&local_af8);
                      local_b20 = operator+((QString *)CONCAT44(iVar24,in_stack_ffffffffffffefe0),
                                            (QString *)in_stack_ffffffffffffefd8);
                      QStringBuilder::operator_cast_to_QString
                                ((QStringBuilder<QString_&,_const_QString_&> *)
                                 in_stack_ffffffffffffefd8);
                      in_stack_fffffffffffff04f = QFile::exists((QString *)local_b10);
                      QString::~QString((QString *)0x123199);
                      if ((in_stack_fffffffffffff04f & 1) == 0) {
                        local_e0c = 0;
                      }
                      else {
                        QString::operator=(local_ac8,(QString *)pQVar11);
                        local_e0c = 0x11;
                      }
                      QString::~QString((QString *)0x1231dd);
                      if (local_e0c != 0) break;
                      QList<QString>::const_iterator::operator++(&local_ad0);
                    }
                    bVar1 = QString::isEmpty((QString *)0x12320d);
                    if (bVar1) {
                      in_stack_fffffffffffff040 = _stderr;
                      QFileInfo::absoluteFilePath();
                      QtPrivate::asString(local_b50);
                      QString::toLocal8Bit
                                ((QString *)
                                 CONCAT26(in_stack_ffffffffffffeffe.ucs,in_stack_ffffffffffffeff8));
                      pcVar7 = QByteArray::constData((QByteArray *)0x123264);
                      fprintf(in_stack_fffffffffffff040,
                              "Import found outside of import paths: %s.\n",pcVar7);
                      QByteArray::~QByteArray((QByteArray *)0x123287);
                      QString::~QString((QString *)0x123294);
                      local_dc1 = 0;
                      local_e0c = 1;
                    }
                    else {
                      pQVar11 = local_ac8;
                      QDir::QDir(local_b88,(QString *)pQVar11);
                      in_stack_ffffffffffffeff8 = SUB86(local_b80,0);
                      in_stack_ffffffffffffeffe.ucs = (char16_t)((ulong)local_b80 >> 0x30);
                      QDir::absolutePath();
                      local_b8a = 0x2f;
                      in_stack_ffffffffffffeff0 = (Options *)local_2e8;
                      operator+((QString *)in_stack_ffffffffffffefe8,
                                (char16_t *)CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                      in_stack_ffffffffffffefe8 = &local_b68;
                      QStringBuilder::operator_cast_to_QString
                                ((QStringBuilder<QString,_char16_t> *)in_stack_ffffffffffffefd8);
                      QString::operator=((QString *)CONCAT44(iVar24,in_stack_ffffffffffffefe0),
                                         (QString *)in_stack_ffffffffffffefd8);
                      QString::~QString((QString *)0x12333b);
                      QStringBuilder<QString,_char16_t>::~QStringBuilder
                                ((QStringBuilder<QString,_char16_t> *)0x123345);
                      QString::~QString((QString *)0x12334f);
                      QDir::~QDir(local_b88);
                      usedDependencies_00 = (QSet<QString> *)0xaaaaaaaaaaaaaaaa;
                      local_b98 = 0xaaaaaaaaaaaaaaaa;
                      local_ba8 = 0xaaaaaaaaaaaaaaaa;
                      uStack_ba0 = 0xaaaaaaaaaaaaaaaa;
                      puVar25 = &local_ba8;
                      QList<QtDependency>::QList((QList<QtDependency> *)0x123391);
                      local_bc8 = local_570;
                      local_be8 = 0xaaaaaaaaaaaaaaaa;
                      uStack_be0 = 0xaaaaaaaaaaaaaaaa;
                      local_bd8 = usedDependencies_00;
                      puStack_bc0 = puVar25;
                      local_bb8 = pQVar11;
                      Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_ffffffffffffefe8,
                                 CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                      QVar18.m_data = (char *)&local_958;
                      QVar18.m_size = (qsizetype)local_300;
                      QJsonObject::value(QVar18);
                      QJsonValue::toString();
                      QJsonValue::~QJsonValue(local_300);
                      Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_ffffffffffffefe8,
                                 CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                      QVar19.m_data = (char *)&local_958;
                      QVar19.m_size = (qsizetype)local_318;
                      QJsonObject::value(QVar19);
                      bVar4 = QJsonValue::toBool(SUB81(local_318,0));
                      QJsonValue::~QJsonValue(local_318);
                      local_c0a = 0x2f;
                      bVar3 = bVar4;
                      local_bf0 = usedDependencies_00;
                      QVar12 = operator+((QString *)in_stack_ffffffffffffefe8,
                                         (char16_t *)CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                      local_c20 = QVar12.a;
                      local_c18 = QVar12.b;
                      local_420 = local_c20;
                      local_418 = local_c18;
                      local_c30 = Qt::Literals::StringLiterals::operator____L1
                                            ((char *)in_stack_ffffffffffffefe8,
                                             CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                      operator+((QStringBuilder<QString_&,_char16_t> *)
                                CONCAT44(iVar24,in_stack_ffffffffffffefe0),
                                (QLatin1String *)in_stack_ffffffffffffefd8);
                      operator+((QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>
                                 *)CONCAT44(iVar24,in_stack_ffffffffffffefe0),
                                (QString *)in_stack_ffffffffffffefd8);
                      local_c32 = 0x5f;
                      operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>
                                 *)CONCAT44(iVar24,in_stack_ffffffffffffefe0),
                                (char16_t *)in_stack_ffffffffffffefd8);
                      operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>
                                 *)CONCAT44(iVar24,in_stack_ffffffffffffefe0),
                                (QString *)in_stack_ffffffffffffefd8);
                      local_c48 = Qt::Literals::StringLiterals::operator____L1
                                            ((char *)in_stack_ffffffffffffefe8,
                                             CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                      operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>,_QString_&>,_char16_t>,_QString_&>
                                 *)CONCAT44(iVar24,in_stack_ffffffffffffefe0),
                                (QLatin1String *)in_stack_ffffffffffffefd8);
                      QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffefd8);
                      QFileInfo::QFileInfo((QFileInfo *)&local_bf0,(QString *)local_c08);
                      QString::~QString((QString *)0x12363e);
                      local_c60 = 0xaaaaaaaaaaaaaaaa;
                      local_c58 = 0xaaaaaaaaaaaaaaaa;
                      local_c50 = 0xaaaaaaaaaaaaaaaa;
                      QFileInfo::absoluteFilePath();
                      local_c68 = 0xaaaaaaaaaaaaaaaa;
                      QSet<QString>::QSet((QSet<QString> *)0x12369c);
                      uVar5 = QFileInfo::exists();
                      if ((((uVar5 & 1) == 0) ||
                          (bVar1 = checkArchitecture(in_stack_ffffffffffffeff0,
                                                     (QString *)in_stack_ffffffffffffefe8), !bVar1))
                         || (bVar1 = readDependenciesFromElf
                                               ((Options *)
                                                CONCAT17(in_stack_fffffffffffff04f,
                                                         in_stack_fffffffffffff048),
                                                (QString *)in_stack_fffffffffffff040,
                                                usedDependencies_00,
                                                (QSet<QString> *)
                                                CONCAT17(bVar3,in_stack_fffffffffffff030)), !bVar1))
                      {
                        if ((bVar4 & 1) != 0) goto LAB_0012374e;
                        if ((*(byte *)(in_RDI + 1) & 1) != 0) {
                          fprintf(_stdout,
                                  "    -- Skipping because the required plugin is missing.\n");
                        }
                        local_e0c = 0x10;
                      }
                      else {
                        scanImports::anon_class_24_3_0a0102aa::operator()
                                  ((anon_class_24_3_0a0102aa *)in_stack_ffffffffffffeff0,
                                   (QString *)in_stack_ffffffffffffefe8);
LAB_0012374e:
                        local_c70 = 0xaaaaaaaaaaaaaaaa;
                        local_c8a = 0x2f;
                        QVar12 = operator+((QString *)in_stack_ffffffffffffefe8,
                                           (char16_t *)CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                        local_ca0 = QVar12.a;
                        local_c98 = QVar12.b;
                        local_450 = local_ca0;
                        local_448 = local_c98;
                        local_cb0 = Qt::Literals::StringLiterals::operator____L1
                                              ((char *)in_stack_ffffffffffffefe8,
                                               CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                        operator+((QStringBuilder<QString_&,_char16_t> *)
                                  CONCAT44(iVar24,in_stack_ffffffffffffefe0),
                                  (QLatin1String *)in_stack_ffffffffffffefd8);
                        QStringBuilder::operator_cast_to_QString
                                  ((QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QLatin1String>
                                    *)in_stack_ffffffffffffefd8);
                        QFileInfo::QFileInfo((QFileInfo *)&local_c70,(QString *)local_c88);
                        QString::~QString((QString *)0x123824);
                        uVar5 = QFileInfo::exists();
                        if ((uVar5 & 1) != 0) {
                          QFileInfo::absoluteFilePath();
                          scanImports::anon_class_24_3_0a0102aa::operator()
                                    ((anon_class_24_3_0a0102aa *)in_stack_ffffffffffffeff0,
                                     (QString *)in_stack_ffffffffffffefe8);
                          QString::~QString((QString *)0x12386e);
                        }
                        local_ce0 = 0xaaaaaaaaaaaaaaaa;
                        local_cd8 = 0xaaaaaaaaaaaaaaaa;
                        local_cd0 = 0xaaaaaaaaaaaaaaaa;
                        Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_ffffffffffffefe8,
                                   CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                        QVar20.m_data = (char *)&local_958;
                        QVar20.m_size = (qsizetype)local_468;
                        QJsonObject::value(QVar20);
                        QJsonValue::toString();
                        QJsonValue::~QJsonValue(local_468);
                        QVar13 = Qt::Literals::StringLiterals::operator____L1
                                           ((char *)in_stack_ffffffffffffefe8,
                                            CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                        local_ed8 = (char *)QVar13.m_size;
                        QVar21.m_data = local_ed8;
                        QVar21.m_size = (qsizetype)&local_ce0;
                        uVar5 = QString::startsWith(QVar21,(CaseSensitivity)QVar13.m_data);
                        if ((uVar5 & 1) == 0) {
                          local_cf8 = 0xaaaaaaaaaaaaaaaa;
                          local_cf0 = 0xaaaaaaaaaaaaaaaa;
                          local_ce8 = 0xaaaaaaaaaaaaaaaa;
                          Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_ffffffffffffefe8,
                                     CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                          QVar22.m_data = (char *)&local_958;
                          QVar22.m_size = (qsizetype)local_480;
                          QJsonObject::value(QVar22);
                          QJsonValue::toArray();
                          QJsonArray::toVariantList();
                          QJsonArray::~QJsonArray(local_d00);
                          QJsonValue::~QJsonValue(local_480);
                          Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_ffffffffffffefe8,
                                     CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                          QVar23.m_data = (char *)&local_958;
                          QVar23.m_size = (qsizetype)local_498;
                          QJsonObject::value(QVar23);
                          QJsonValue::toArray();
                          QJsonArray::toVariantList();
                          QList<QVariant>::append
                                    ((QList<QVariant> *)in_stack_ffffffffffffeff0,
                                     (QList<QVariant> *)in_stack_ffffffffffffefe8);
                          QList<QVariant>::~QList((QList<QVariant> *)0x123a97);
                          QJsonArray::~QJsonArray(local_d20);
                          QJsonValue::~QJsonValue(local_498);
                          bVar1 = false;
                          local_d28.i = (QVariant *)0xaaaaaaaaaaaaaaaa;
                          local_d28 = QList<QVariant>::begin
                                                ((QList<QVariant> *)
                                                 CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                          local_d30.i = (QVariant *)0xaaaaaaaaaaaaaaaa;
                          local_d30 = QList<QVariant>::end
                                                ((QList<QVariant> *)
                                                 CONCAT44(iVar24,in_stack_ffffffffffffefe0));
                          while( true ) {
                            local_d38 = local_d30.i;
                            bVar2 = QList<QVariant>::iterator::operator!=(&local_d28,local_d30);
                            if (!bVar2) break;
                            QList<QVariant>::iterator::operator*(&local_d28);
                            local_d40 = 0xaaaaaaaaaaaaaaaa;
                            QVariant::toString();
                            QFileInfo::QFileInfo((QFileInfo *)&local_d40,(QString *)local_d58);
                            QString::~QString((QString *)0x123bbe);
                            uVar5 = QFileInfo::exists();
                            if ((uVar5 & 1) == 0) {
                              bVar1 = true;
                              local_e0c = 0x13;
                            }
                            else {
                              QFileInfo::absoluteFilePath();
                              scanImports::anon_class_24_3_0a0102aa::operator()
                                        ((anon_class_24_3_0a0102aa *)in_stack_ffffffffffffeff0,
                                         (QString *)in_stack_ffffffffffffefe8);
                              QString::~QString((QString *)0x123c1b);
                              local_e0c = 0;
                            }
                            QFileInfo::~QFileInfo((QFileInfo *)&local_d40);
                            if (local_e0c != 0) break;
                            QList<QVariant>::iterator::operator++(&local_d28);
                          }
                          if (bVar1) {
                            if ((*(byte *)(in_RDI + 1) & 1) != 0) {
                              fprintf(_stdout,
                                      "    -- Skipping because the required qml files are missing.\n"
                                     );
                            }
                            local_e0c = 0x10;
                          }
                          else {
                            local_e0c = 0;
                          }
                          QList<QVariant>::~QList((QList<QVariant> *)0x123cab);
                          if (local_e0c == 0) goto LAB_00123cba;
                        }
                        else {
LAB_00123cba:
                          QHash<QString,_QList<QtDependency>_>::operator[]
                                    ((QHash<QString,_QList<QtDependency>_> *)
                                     in_stack_ffffffffffffeff0,(QString *)in_stack_ffffffffffffefe8)
                          ;
                          QList<QtDependency>::append
                                    ((QList<QtDependency> *)in_stack_ffffffffffffeff0,
                                     (QList<QtDependency> *)in_stack_ffffffffffffefe8);
                          local_e0c = 0;
                        }
                        QString::~QString((QString *)0x123d05);
                        QFileInfo::~QFileInfo((QFileInfo *)&local_c70);
                      }
                      QSet<QString>::~QSet((QSet<QString> *)0x123d1f);
                      QString::~QString((QString *)0x123d2c);
                      QFileInfo::~QFileInfo((QFileInfo *)&local_bf0);
                      QString::~QString((QString *)0x123d46);
                      QList<QtDependency>::~QList((QList<QtDependency> *)0x123d53);
                    }
                    QString::~QString((QString *)0x123d60);
                  }
                  QString::~QString((QString *)0x123d6d);
                  QUrl::~QUrl((QUrl *)&local_a10);
                  QString::~QString((QString *)0x123d87);
                }
                QFileInfo::~QFileInfo((QFileInfo *)local_9e8);
                if (local_e0c == 0) goto LAB_00123da7;
              }
              QString::~QString((QString *)0x123dbf);
              QJsonObject::~QJsonObject((QJsonObject *)&local_958);
            }
            else {
              fprintf(_stderr,"Invalid format of qmlimportscanner output.\n");
              local_dc1 = 0;
              local_e0c = 1;
            }
            QJsonValue::~QJsonValue((QJsonValue *)&local_268);
            if ((local_e0c != 0) && (local_e0c != 0x10)) goto LAB_00123e20;
            iVar24 = local_e0c;
          }
          local_dc1 = 1;
          local_e0c = iVar24;
LAB_00123e20:
          QJsonArray::~QJsonArray((QJsonArray *)&local_950);
        }
        else {
          fprintf(_stderr,"Invalid json output from qmlimportscanner.\n");
          local_dc1 = 0;
        }
        QJsonDocument::~QJsonDocument((QJsonDocument *)&local_948);
        QByteArray::~QByteArray((QByteArray *)0x123e47);
      }
      std::unique_ptr<_IO_FILE,_Closer>::~unique_ptr
                ((unique_ptr<_IO_FILE,_Closer> *)CONCAT44(local_e0c,in_stack_ffffffffffffefe0));
    }
  }
  else {
    fprintf(_stderr,
            "Warning: no \'qml\' directory found under Qt install directory or import paths. Skipping QML dependency scanning.\n"
           );
    local_dc1 = 1;
  }
  QString::~QString((QString *)0x123e61);
  QList<QString>::~QList((QList<QString> *)0x123e6e);
  QString::~QString((QString *)0x123e7b);
  if (*(char **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_dc1 & 1);
}

Assistant:

bool scanImports(Options *options, QSet<QString> *usedDependencies)
{
    if (options->verbose)
        fprintf(stdout, "Scanning for QML imports.\n");

    QString qmlImportScanner;
    if (!options->qmlImportScannerBinaryPath.isEmpty()) {
        qmlImportScanner = options->qmlImportScannerBinaryPath;
    } else {
        qmlImportScanner = execSuffixAppended(options->qtLibExecsDirectory +
                                              "/qmlimportscanner"_L1);
    }

    QStringList importPaths;

    // In Conan's case, qtInstallDirectory will point only to qtbase installed files, which
    // lacks a qml directory. We don't want to pass it as an import path if it doesn't exist
    // because it will cause qmlimportscanner to fail.
    // This also covers the case when only qtbase is installed in a regular Qt build.
    const QString mainImportPath = options->qtInstallDirectory + u'/' + options->qtQmlDirectory;
    if (QFile::exists(mainImportPath))
        importPaths += shellQuote(mainImportPath);

    // These are usually provided by CMake in the deployment json file from paths specified
    // in CMAKE_FIND_ROOT_PATH. They might not have qml modules.
    for (const QString &prefix : options->extraPrefixDirs)
        if (QFile::exists(prefix + "/qml"_L1))
            importPaths += shellQuote(prefix + "/qml"_L1);

    // These are provided by both CMake and qmake.
    for (const QString &qmlImportPath : std::as_const(options->qmlImportPaths)) {
        if (QFile::exists(qmlImportPath)) {
            importPaths += shellQuote(qmlImportPath);
        } else {
            fprintf(stderr, "Warning: QML import path %s does not exist.\n",
                    qPrintable(qmlImportPath));
        }
    }

    bool qmlImportExists = false;

    for (const QString &import : importPaths) {
        if (QDir().exists(import)) {
            qmlImportExists = true;
            break;
        }
    }

    // Check importPaths without rootPath, since we need at least one qml plugins
    // folder to run a QML file
    if (!qmlImportExists) {
        fprintf(stderr, "Warning: no 'qml' directory found under Qt install directory "
                "or import paths. Skipping QML dependency scanning.\n");
        return true;
    }

    if (!QFile::exists(qmlImportScanner)) {
        fprintf(stderr, "%s: qmlimportscanner not found at %s\n",
                qmlImportExists ? "Error"_L1.data() : "Warning"_L1.data(),
                qPrintable(qmlImportScanner));
        return true;
    }

    for (auto rootPath : options->rootPaths) {
        rootPath = QFileInfo(rootPath).absoluteFilePath();

        if (!rootPath.endsWith(u'/'))
            rootPath += u'/';

        // After checking for qml folder imports we can add rootPath
        if (!rootPath.isEmpty())
            importPaths += shellQuote(rootPath);

        qmlImportScanner += " -rootPath %1"_L1.arg(shellQuote(rootPath));
    }

    if (!options->qrcFiles.isEmpty()) {
        qmlImportScanner += " -qrcFiles"_L1;
        for (const QString &qrcFile : options->qrcFiles)
            qmlImportScanner += u' ' + shellQuote(qrcFile);
    }

    qmlImportScanner += " -importPath %1"_L1.arg(importPaths.join(u' '));

    if (options->verbose) {
        fprintf(stdout, "Running qmlimportscanner with the following command: %s\n",
            qmlImportScanner.toLocal8Bit().constData());
    }

    auto qmlImportScannerCommand = openProcess(qmlImportScanner);
    if (qmlImportScannerCommand == 0) {
        fprintf(stderr, "Couldn't run qmlimportscanner.\n");
        return false;
    }

    QByteArray output;
    char buffer[512];
    while (fgets(buffer, sizeof(buffer), qmlImportScannerCommand.get()) != nullptr)
        output += QByteArray(buffer, qstrlen(buffer));

    QJsonDocument jsonDocument = QJsonDocument::fromJson(output);
    if (jsonDocument.isNull()) {
        fprintf(stderr, "Invalid json output from qmlimportscanner.\n");
        return false;
    }

    QJsonArray jsonArray = jsonDocument.array();
    for (int i=0; i<jsonArray.count(); ++i) {
        QJsonValue value = jsonArray.at(i);
        if (!value.isObject()) {
            fprintf(stderr, "Invalid format of qmlimportscanner output.\n");
            return false;
        }

        QJsonObject object = value.toObject();
        QString path = object.value("path"_L1).toString();
        if (path.isEmpty()) {
            fprintf(stderr, "Warning: QML import could not be resolved in any of the import paths: %s\n",
                    qPrintable(object.value("name"_L1).toString()));
        } else if (object.value("type"_L1).toString() == "module"_L1) {
            if (options->verbose)
                fprintf(stdout, "  -- Adding '%s' as QML dependency\n", qPrintable(path));

            QFileInfo info(path);

            // The qmlimportscanner sometimes outputs paths that do not exist.
            if (!info.exists()) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because path does not exist.\n");
                continue;
            }

            QString absolutePath = info.absolutePath();
            if (!absolutePath.endsWith(u'/'))
                absolutePath += u'/';

            const QUrl url(object.value("name"_L1).toString());

            const QString moduleUrlPath = u"/"_s + url.toString().replace(u'.', u'/');
            if (checkCanImportFromRootPaths(options, info.absolutePath(), moduleUrlPath)) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because path is in QML root path.\n");
                continue;
            }

            QString importPathOfThisImport;
            for (const QString &importPath : std::as_const(importPaths)) {
                QString cleanImportPath = QDir::cleanPath(importPath);
                if (QFile::exists(cleanImportPath + moduleUrlPath)) {
                    importPathOfThisImport = importPath;
                    break;
                }
            }

            if (importPathOfThisImport.isEmpty()) {
                fprintf(stderr, "Import found outside of import paths: %s.\n", qPrintable(info.absoluteFilePath()));
                return false;
            }

            importPathOfThisImport = QDir(importPathOfThisImport).absolutePath() + u'/';
            QList<QtDependency> qmlImportsDependencies;
            auto collectQmlDependency = [&usedDependencies, &qmlImportsDependencies,
                                         &importPathOfThisImport](const QString &filePath) {
                if (!usedDependencies->contains(filePath)) {
                    usedDependencies->insert(filePath);
                    qmlImportsDependencies += QtDependency(
                            "qml/"_L1 + filePath.mid(importPathOfThisImport.size()),
                            filePath);
                }
            };

            QString plugin = object.value("plugin"_L1).toString();
            bool pluginIsOptional = object.value("pluginIsOptional"_L1).toBool();
            QFileInfo pluginFileInfo = QFileInfo(
                    path + u'/' + "lib"_L1 + plugin + u'_'
                    + options->currentArchitecture + ".so"_L1);
            QString pluginFilePath = pluginFileInfo.absoluteFilePath();
            QSet<QString> remainingDependencies;
            if (pluginFileInfo.exists() && checkArchitecture(*options, pluginFilePath)
                && readDependenciesFromElf(options, pluginFilePath, usedDependencies,
                                           &remainingDependencies)) {
                collectQmlDependency(pluginFilePath);
            } else if (!pluginIsOptional) {
                if (options->verbose)
                    fprintf(stdout, "    -- Skipping because the required plugin is missing.\n");
                continue;
            }

            QFileInfo qmldirFileInfo = QFileInfo(path + u'/' + "qmldir"_L1);
            if (qmldirFileInfo.exists()) {
                collectQmlDependency(qmldirFileInfo.absoluteFilePath());
            }

            QString prefer = object.value("prefer"_L1).toString();
            // If the preferred location of Qml files points to the Qt resources, this means
            // that all Qml files has been embedded into plugin and we should not copy them to the
            // android rcc bundle
            if (!prefer.startsWith(":/"_L1)) {
                QVariantList qmlFiles =
                        object.value("components"_L1).toArray().toVariantList();
                qmlFiles.append(object.value("scripts"_L1).toArray().toVariantList());
                bool qmlFilesMissing = false;
                for (const auto &qmlFileEntry : qmlFiles) {
                    QFileInfo fileInfo(qmlFileEntry.toString());
                    if (!fileInfo.exists()) {
                        qmlFilesMissing = true;
                        break;
                    }
                    collectQmlDependency(fileInfo.absoluteFilePath());
                }

                if (qmlFilesMissing) {
                    if (options->verbose)
                        fprintf(stdout,
                                "    -- Skipping because the required qml files are missing.\n");
                    continue;
                }
            }

            options->qtDependencies[options->currentArchitecture].append(qmlImportsDependencies);
        } else {
            // We don't need to handle file and directory imports. Generally those should be
            // considered as part of the application and are therefore scanned separately.
        }
    }

    return true;
}